

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O3

void __thiscall
CUI::DoLabelHighlighted
          (CUI *this,CUIRect *pRect,char *pText,char *pHighlighted,float FontSize,vec4 *TextColor,
          vec4 *HighlightColor,int Align)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  CTextCursor *this_00;
  ITextRender *pIVar5;
  
  if (DoLabelHighlighted(CUIRect_const*,char_const*,char_const*,float,vector4_base<float>const&,vector4_base<float>const&,int)
      ::s_Cursor == '\0') {
    iVar2 = __cxa_guard_acquire(&DoLabelHighlighted(CUIRect_const*,char_const*,char_const*,float,vector4_base<float>const&,vector4_base<float>const&,int)
                                 ::s_Cursor);
    if (iVar2 != 0) {
      CTextCursor::CTextCursor(&DoLabelHighlighted::s_Cursor);
      __cxa_atexit(CTextCursor::~CTextCursor,&DoLabelHighlighted::s_Cursor,&__dso_handle);
      __cxa_guard_release(&DoLabelHighlighted(CUIRect_const*,char_const*,char_const*,float,vector4_base<float>const&,vector4_base<float>const&,int)
                           ::s_Cursor);
    }
  }
  this_00 = &DoLabelHighlighted::s_Cursor;
  CTextCursor::Reset(&DoLabelHighlighted::s_Cursor,-1);
  DoLabelHighlighted::s_Cursor.m_MaxWidth = pRect->w;
  DoLabelHighlighted::s_Cursor.m_FontSize = FontSize;
  ApplyCursorAlign((CUI *)this_00,&DoLabelHighlighted::s_Cursor,pRect,Align);
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[4])
            ((TextColor->field_0).x,(TextColor->field_1).y,(TextColor->field_2).z,
             (TextColor->field_3).w);
  if ((pHighlighted != (char *)0x0) && (*pHighlighted != '\0')) {
    pcVar3 = str_find_nocase(pText,pHighlighted);
    if (pcVar3 != (char *)0x0) {
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                (this->m_pTextRender,&DoLabelHighlighted::s_Cursor,pText,
                 (ulong)(uint)((int)pcVar3 - (int)pText));
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                ((HighlightColor->field_0).x,(HighlightColor->field_1).y,(HighlightColor->field_2).z
                 ,(HighlightColor->field_3).w);
      pIVar5 = this->m_pTextRender;
      uVar1 = str_length(pHighlighted);
      (*(pIVar5->super_IInterface)._vptr_IInterface[7])
                (pIVar5,&DoLabelHighlighted::s_Cursor,pcVar3,(ulong)uVar1);
      (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                ((TextColor->field_0).x,(TextColor->field_1).y,(TextColor->field_2).z,
                 (TextColor->field_3).w);
      pIVar5 = this->m_pTextRender;
      iVar2 = str_length(pHighlighted);
      pText = pcVar3 + iVar2;
      pp_Var4 = (pIVar5->super_IInterface)._vptr_IInterface;
      goto LAB_0018ae92;
    }
  }
  pIVar5 = this->m_pTextRender;
  pp_Var4 = (pIVar5->super_IInterface)._vptr_IInterface;
LAB_0018ae92:
  (*pp_Var4[7])(pIVar5,&DoLabelHighlighted::s_Cursor,pText,0xffffffff);
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[0x10])
            (0x3f800000,this->m_pTextRender,&DoLabelHighlighted::s_Cursor,0,0xffffffff);
  return;
}

Assistant:

void CUI::DoLabelHighlighted(const CUIRect *pRect, const char *pText, const char *pHighlighted, float FontSize, const vec4 &TextColor, const vec4 &HighlightColor, int Align)
{
	static CTextCursor s_Cursor;
	s_Cursor.Reset();
	s_Cursor.m_FontSize = FontSize;
	s_Cursor.m_MaxWidth = pRect->w;
	ApplyCursorAlign(&s_Cursor, pRect, Align);

	TextRender()->TextColor(TextColor);
	const char *pMatch = pHighlighted && pHighlighted[0] ? str_find_nocase(pText, pHighlighted) : 0;
	if(pMatch)
	{
		TextRender()->TextDeferred(&s_Cursor, pText, (int)(pMatch - pText));
		TextRender()->TextColor(HighlightColor);
		TextRender()->TextDeferred(&s_Cursor, pMatch, str_length(pHighlighted));
		TextRender()->TextColor(TextColor);
		TextRender()->TextDeferred(&s_Cursor, pMatch + str_length(pHighlighted), -1);
	}
	else
		TextRender()->TextDeferred(&s_Cursor, pText, -1);

	TextRender()->DrawTextOutlined(&s_Cursor);
}